

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1_hash.cpp
# Opt level: O0

void __thiscall
libtorrent::anon_unknown_4::bits_shift_right(anon_unknown_4 *this,span<unsigned_int> number,int n)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  index_type iVar5;
  uint *puVar6;
  uint *__src;
  byte bVar7;
  int local_28;
  int i;
  int number_size;
  int num_words;
  int n_local;
  span<unsigned_int> number_local;
  
  number_local.m_ptr = number.m_ptr;
  number_size = (int)number.m_len;
  iVar2 = number_size / 0x20;
  _num_words = this;
  iVar5 = span<unsigned_int>::size((span<unsigned_int> *)&num_words);
  iVar3 = (int)iVar5;
  if (iVar2 < iVar3) {
    if (0 < iVar2) {
      puVar6 = span<unsigned_int>::data((span<unsigned_int> *)&num_words);
      __src = span<unsigned_int>::data((span<unsigned_int> *)&num_words);
      memmove(puVar6 + iVar2,__src,(long)(iVar3 - iVar2) << 2);
      puVar6 = span<unsigned_int>::data((span<unsigned_int> *)&num_words);
      memset(puVar6,0,(long)iVar2 << 2);
      number_size = number_size % 0x20;
    }
    if (0 < number_size) {
      puVar6 = span<unsigned_int>::operator[]((span<unsigned_int> *)&num_words,(long)(iVar3 + -1));
      uVar4 = libtorrent::aux::network_to_host(*puVar6);
      puVar6 = span<unsigned_int>::operator[]((span<unsigned_int> *)&num_words,(long)(iVar3 + -1));
      *puVar6 = uVar4;
      while (local_28 = iVar3 + -1, bVar7 = (byte)number_size, 0 < local_28) {
        puVar6 = span<unsigned_int>::operator[]((span<unsigned_int> *)&num_words,(long)local_28);
        *puVar6 = *puVar6 >> (bVar7 & 0x1f);
        puVar6 = span<unsigned_int>::operator[]((span<unsigned_int> *)&num_words,(long)(iVar3 + -2))
        ;
        uVar4 = libtorrent::aux::network_to_host(*puVar6);
        puVar6 = span<unsigned_int>::operator[]((span<unsigned_int> *)&num_words,(long)(iVar3 + -2))
        ;
        *puVar6 = uVar4;
        puVar6 = span<unsigned_int>::operator[]((span<unsigned_int> *)&num_words,(long)(iVar3 + -2))
        ;
        uVar1 = *puVar6;
        puVar6 = span<unsigned_int>::operator[]((span<unsigned_int> *)&num_words,(long)local_28);
        *puVar6 = uVar1 << (0x20 - bVar7 & 0x1f) | *puVar6;
        puVar6 = span<unsigned_int>::operator[]((span<unsigned_int> *)&num_words,(long)local_28);
        uVar4 = libtorrent::aux::host_to_network(*puVar6);
        puVar6 = span<unsigned_int>::operator[]((span<unsigned_int> *)&num_words,(long)local_28);
        *puVar6 = uVar4;
        iVar3 = local_28;
      }
      puVar6 = span<unsigned_int>::operator[]((span<unsigned_int> *)&num_words,0);
      *puVar6 = *puVar6 >> (bVar7 & 0x1f);
      puVar6 = span<unsigned_int>::operator[]((span<unsigned_int> *)&num_words,0);
      uVar4 = libtorrent::aux::host_to_network(*puVar6);
      puVar6 = span<unsigned_int>::operator[]((span<unsigned_int> *)&num_words,0);
      *puVar6 = uVar4;
    }
  }
  else {
    puVar6 = span<unsigned_int>::data((span<unsigned_int> *)&num_words);
    iVar5 = span<unsigned_int>::size((span<unsigned_int> *)&num_words);
    memset(puVar6,0,iVar5 << 2);
  }
  return;
}

Assistant:

void bits_shift_right(span<std::uint32_t> const number, int n) noexcept
	{
		TORRENT_ASSERT(n >= 0);
		int const num_words = n / 32;
		int const number_size = int(number.size());
		if (num_words >= number_size)
		{
			std::memset(number.data(), 0, std::size_t(number.size() * 4));
			return;
		}
		if (num_words > 0)
		{
			std::memmove(number.data() + num_words
				, number.data(), std::size_t(number_size - num_words) * sizeof(std::uint32_t));
			std::memset(number.data(), 0, std::size_t(num_words) * sizeof(std::uint32_t));
			n -= num_words * 32;
		}
		if (n > 0)
		{
			// keep in mind that the uint32_t are stored in network
			// byte order, so they have to be byteswapped before
			// applying the shift operations, and then byteswapped
			// back again.
			number[number_size - 1] = aux::network_to_host(number[number_size - 1]);

			for (int i = number_size - 1; i > 0; --i)
			{
				number[i] >>= n;
				number[i - 1] = aux::network_to_host(number[i - 1]);
				number[i] |= (number[i - 1] << (32 - n)) & 0xffffffff;
				number[i] = aux::host_to_network(number[i]);
			}
			number[0] >>= n;
			number[0] = aux::host_to_network(number[0]);
		}
	}